

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamRandomAccessController::SetErrorString
          (BamRandomAccessController *this,string *where,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&bStack_58,where,": ");
  std::operator+(&local_38,&bStack_58,what);
  std::__cxx11::string::operator=((string *)&this->m_errorString,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  return;
}

Assistant:

void BamRandomAccessController::SetErrorString(const string& where, const string& what) {
    m_errorString = where + ": " + what;
}